

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O3

void __thiscall Object::externalOcclusion(Object *this,Object *obj,Vector2d *obs)

{
  unsigned_long uVar1;
  pointer pEVar2;
  pointer pEVar3;
  HeapType heap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  local_58;
  EdgeCompFunctor local_38;
  
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.egs = &this->edges;
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(&local_58,&local_38,&local_78);
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar3 != pEVar2) {
    do {
      if (pEVar2[(long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start].valid == true) {
        std::
        priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
        ::emplace<unsigned_long&>
                  ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
                    *)&local_58,(unsigned_long *)&local_78);
        pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar3 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_78.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 1);
    } while (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start <
             (pointer)(((long)pEVar3 - (long)pEVar2 >> 5) * -0x5555555555555555));
  }
  while (local_58.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_58.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    uVar1 = *local_58.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(&local_58);
    externalProjector(obj,pEVar2 + uVar1,obs);
  }
  if (local_58.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.c.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.c.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Object::externalOcclusion(Object& obj, Eigen::Vector2d obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid)
            heap.emplace(i);
    }
    while (heap.empty() == false) {
        size_t top = heap.top();
        Edge& this_edge = edges[top];
        heap.pop();
        obj.externalProjector(this_edge, obs);
    }
}